

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

Bool mainGtU(UInt32 i1,UInt32 i2,UChar *block,UInt16 *quadrant,UInt32 nblock,Int32 *budget)

{
  UInt16 s2;
  UInt16 s1;
  UChar c2;
  UChar c1;
  Int32 k;
  Int32 *budget_local;
  UInt32 nblock_local;
  UInt16 *quadrant_local;
  UChar *block_local;
  UInt32 i2_local;
  UInt32 i1_local;
  bool local_1;
  
  if (block[i1] == block[i2]) {
    if (block[i1 + 1] == block[i2 + 1]) {
      if (block[i1 + 2] == block[i2 + 2]) {
        if (block[i1 + 3] == block[i2 + 3]) {
          if (block[i1 + 4] == block[i2 + 4]) {
            if (block[i1 + 5] == block[i2 + 5]) {
              if (block[i1 + 6] == block[i2 + 6]) {
                if (block[i1 + 7] == block[i2 + 7]) {
                  if (block[i1 + 8] == block[i2 + 8]) {
                    if (block[i1 + 9] == block[i2 + 9]) {
                      if (block[i1 + 10] == block[i2 + 10]) {
                        if (block[i1 + 0xb] == block[i2 + 0xb]) {
                          i1_local = i1 + 0xc;
                          i2_local = i2 + 0xc;
                          k = nblock + 8;
                          do {
                            if (block[i1_local] != block[i2_local]) {
                              return block[i2_local] < block[i1_local];
                            }
                            if (quadrant[i1_local] != quadrant[i2_local]) {
                              return quadrant[i2_local] < quadrant[i1_local];
                            }
                            if (block[i1_local + 1] != block[i2_local + 1]) {
                              return block[i2_local + 1] < block[i1_local + 1];
                            }
                            if (quadrant[i1_local + 1] != quadrant[i2_local + 1]) {
                              return quadrant[i2_local + 1] < quadrant[i1_local + 1];
                            }
                            if (block[i1_local + 2] != block[i2_local + 2]) {
                              return block[i2_local + 2] < block[i1_local + 2];
                            }
                            if (quadrant[i1_local + 2] != quadrant[i2_local + 2]) {
                              return quadrant[i2_local + 2] < quadrant[i1_local + 2];
                            }
                            if (block[i1_local + 3] != block[i2_local + 3]) {
                              return block[i2_local + 3] < block[i1_local + 3];
                            }
                            if (quadrant[i1_local + 3] != quadrant[i2_local + 3]) {
                              return quadrant[i2_local + 3] < quadrant[i1_local + 3];
                            }
                            if (block[i1_local + 4] != block[i2_local + 4]) {
                              return block[i2_local + 4] < block[i1_local + 4];
                            }
                            if (quadrant[i1_local + 4] != quadrant[i2_local + 4]) {
                              return quadrant[i2_local + 4] < quadrant[i1_local + 4];
                            }
                            if (block[i1_local + 5] != block[i2_local + 5]) {
                              return block[i2_local + 5] < block[i1_local + 5];
                            }
                            if (quadrant[i1_local + 5] != quadrant[i2_local + 5]) {
                              return quadrant[i2_local + 5] < quadrant[i1_local + 5];
                            }
                            if (block[i1_local + 6] != block[i2_local + 6]) {
                              return block[i2_local + 6] < block[i1_local + 6];
                            }
                            if (quadrant[i1_local + 6] != quadrant[i2_local + 6]) {
                              return quadrant[i2_local + 6] < quadrant[i1_local + 6];
                            }
                            if (block[i1_local + 7] != block[i2_local + 7]) {
                              return block[i2_local + 7] < block[i1_local + 7];
                            }
                            if (quadrant[i1_local + 7] != quadrant[i2_local + 7]) {
                              return quadrant[i2_local + 7] < quadrant[i1_local + 7];
                            }
                            i1_local = i1_local + 8;
                            i2_local = i2_local + 8;
                            if (nblock <= i1_local) {
                              i1_local = i1_local - nblock;
                            }
                            if (nblock <= i2_local) {
                              i2_local = i2_local - nblock;
                            }
                            k = k + -8;
                            *budget = *budget + -1;
                          } while (-1 < k);
                          local_1 = false;
                        }
                        else {
                          local_1 = block[i2 + 0xb] < block[i1 + 0xb];
                        }
                      }
                      else {
                        local_1 = block[i2 + 10] < block[i1 + 10];
                      }
                    }
                    else {
                      local_1 = block[i2 + 9] < block[i1 + 9];
                    }
                  }
                  else {
                    local_1 = block[i2 + 8] < block[i1 + 8];
                  }
                }
                else {
                  local_1 = block[i2 + 7] < block[i1 + 7];
                }
              }
              else {
                local_1 = block[i2 + 6] < block[i1 + 6];
              }
            }
            else {
              local_1 = block[i2 + 5] < block[i1 + 5];
            }
          }
          else {
            local_1 = block[i2 + 4] < block[i1 + 4];
          }
        }
        else {
          local_1 = block[i2 + 3] < block[i1 + 3];
        }
      }
      else {
        local_1 = block[i2 + 2] < block[i1 + 2];
      }
    }
    else {
      local_1 = block[i2 + 1] < block[i1 + 1];
    }
  }
  else {
    local_1 = block[i2] < block[i1];
  }
  return local_1;
}

Assistant:

static
__inline__
Bool mainGtU ( UInt32  i1, 
               UInt32  i2,
               UChar*  block, 
               UInt16* quadrant,
               UInt32  nblock,
               Int32*  budget )
{
   Int32  k;
   UChar  c1, c2;
   UInt16 s1, s2;

   AssertD ( i1 != i2, "mainGtU" );
   /* 1 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 2 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 3 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 4 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 5 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 6 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 7 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 8 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 9 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 10 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 11 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;
   /* 12 */
   c1 = block[i1]; c2 = block[i2];
   if (c1 != c2) return (c1 > c2);
   i1++; i2++;

   k = nblock + 8;

   do {
      /* 1 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 2 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 3 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 4 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 5 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 6 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 7 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;
      /* 8 */
      c1 = block[i1]; c2 = block[i2];
      if (c1 != c2) return (c1 > c2);
      s1 = quadrant[i1]; s2 = quadrant[i2];
      if (s1 != s2) return (s1 > s2);
      i1++; i2++;

      if (i1 >= nblock) i1 -= nblock;
      if (i2 >= nblock) i2 -= nblock;

      k -= 8;
      (*budget)--;
   }
      while (k >= 0);

   return False;
}